

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O1

void Amap_CreateRulesTwo(Amap_Lib_t *p,Vec_Int_t *vNods,Vec_Int_t *vNods0,Vec_Int_t *vNods1,int fXor
                        )

{
  int iFan0;
  int iFan1;
  int iVar1;
  long lVar2;
  long lVar3;
  long local_40;
  
  if (0 < vNods0->nSize) {
    local_40 = 0;
    do {
      if (0 < vNods1->nSize) {
        iFan0 = vNods0->pArray[local_40];
        lVar2 = 0;
        do {
          iFan1 = vNods1->pArray[lVar2];
          iVar1 = Amap_LibFindNode(p,iFan0,iFan1,fXor);
          if (iVar1 == -1) {
            iVar1 = Amap_LibCreateNode(p,iFan0,iFan1,fXor);
          }
          if (iVar1 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          if (0 < (long)vNods->nSize) {
            lVar3 = 0;
            do {
              if (vNods->pArray[lVar3] == iVar1 * 2) goto LAB_0044c1e2;
              lVar3 = lVar3 + 1;
            } while (vNods->nSize != lVar3);
          }
          Vec_IntPush(vNods,iVar1 * 2);
LAB_0044c1e2:
          lVar2 = lVar2 + 1;
        } while (lVar2 < vNods1->nSize);
      }
      local_40 = local_40 + 1;
    } while (local_40 < vNods0->nSize);
  }
  return;
}

Assistant:

void Amap_CreateRulesTwo( Amap_Lib_t * p, Vec_Int_t * vNods, Vec_Int_t * vNods0, Vec_Int_t * vNods1, int fXor )
{
    int i, k, iNod, iNod0, iNod1;
    Vec_IntForEachEntry( vNods0, iNod0, i )
    Vec_IntForEachEntry( vNods1, iNod1, k )
    {
        iNod = Amap_LibFindNode( p, iNod0, iNod1, fXor );
        if ( iNod == -1 )
            iNod = Amap_LibCreateNode( p, iNod0, iNod1, fXor );
        Vec_IntPushUnique( vNods, Abc_Var2Lit(iNod, 0) );
    }
}